

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

void __thiscall ON_Quaternion::SetRotation(ON_Quaternion *this,double angle,ON_3dVector *axis)

{
  double dVar1;
  double local_38;
  double s;
  ON_3dVector *axis_local;
  double angle_local;
  ON_Quaternion *this_local;
  
  dVar1 = ON_3dVector::Length(axis);
  if (dVar1 <= 0.0) {
    local_38 = 0.0;
  }
  else {
    local_38 = sin(angle * 0.5);
    local_38 = local_38 / dVar1;
  }
  dVar1 = cos(angle * 0.5);
  this->a = dVar1;
  this->b = local_38 * axis->x;
  this->c = local_38 * axis->y;
  this->d = local_38 * axis->z;
  return;
}

Assistant:

void ON_Quaternion::SetRotation(double angle, const ON_3dVector& axis)
{
  double s = axis.Length();
  s = (s > 0.0) ? sin(0.5*angle)/s : 0.0;
  a = cos(0.5*angle);
  b = s*axis.x;
  c = s*axis.y;
  d = s*axis.z;
}